

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int cd_type_set_type(parser_info *info)

{
  coda_type *type;
  coda_format *pcVar1;
  node_info *pnVar2;
  
  type = (coda_type *)info->node->parent->data;
  if (type->description != (char *)0x0) {
    coda_type_set_description((coda_type *)info->node->data,type->description);
  }
  if (type->attributes != (coda_type_record *)0x0) {
    pcVar1 = (coda_format *)info->node->data;
    if (*(undefined8 *)(pcVar1 + 0xc) != coda_format_ascii) {
      __assert_fail("((coda_type *)info->node->data)->attributes == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                    ,0xe4a,"int cd_type_set_type(parser_info *)");
    }
    *(coda_type_record **)(pcVar1 + 0xc) = type->attributes;
    type_set_format((coda_type *)type->attributes,*pcVar1);
    type->attributes = (coda_type_record *)0x0;
  }
  coda_type_release(type);
  pnVar2 = info->node;
  pnVar2->parent->data = pnVar2->data;
  pnVar2->data = (void *)0x0;
  return 0;
}

Assistant:

static int cd_type_set_type(parser_info *info)
{
    coda_type *type;

    type = (coda_type *)info->node->parent->data;
    if (type->description != NULL)
    {
        coda_type_set_description((coda_type *)info->node->data, type->description);
    }
    if (type->attributes != NULL)
    {
        assert(((coda_type *)info->node->data)->attributes == NULL);
        ((coda_type *)info->node->data)->attributes = type->attributes;
        /* update format of attributes to that of new type */
        type_set_format((coda_type *)type->attributes, ((coda_type *)info->node->data)->format);
        type->attributes = NULL;
    }
    coda_type_release(type);
    info->node->parent->data = info->node->data;
    info->node->data = NULL;

    return 0;
}